

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_spline.cpp
# Opt level: O3

ChQuaternion<double> * __thiscall
chrono::ChFunctionRotation_spline::Get_q
          (ChQuaternion<double> *__return_storage_ptr__,ChFunctionRotation_spline *this,double s)

{
  long lVar1;
  int iVar2;
  pointer pCVar3;
  int i;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  ChVectorDynamic<> N;
  double local_60;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_58;
  double local_40;
  double local_38;
  double local_30;
  
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if (this->closed == true) {
    s = fmod(s,1.0);
  }
  dVar13 = ComputeKnotUfromU(this,s);
  i = geometry::ChBasisToolsBspline::FindSpan(this->p,dVar13,&this->knots);
  local_58.m_storage.m_data = (double *)0x0;
  local_58.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_58,(long)this->p + 1);
  geometry::ChBasisToolsBspline::BasisEvaluate
            (this->p,i,dVar13,&this->knots,(ChVectorDynamic<> *)&local_58);
  iVar2 = this->p;
  pCVar3 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar41 = 0.0;
  lVar4 = (long)i - (long)iVar2;
  dVar13 = pCVar3[lVar4].m_data[0];
  dVar17 = pCVar3[lVar4].m_data[1];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar17;
  dVar28 = pCVar3[lVar4].m_data[2];
  dVar14 = pCVar3[lVar4].m_data[3];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar14;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __return_storage_ptr__->m_data[3] = 0.0;
  if (0 < local_58.m_storage.m_rows) {
    lVar4 = 0;
    do {
      dVar41 = dVar41 + local_58.m_storage.m_data[lVar4];
      lVar4 = lVar4 + 1;
    } while (local_58.m_storage.m_rows != lVar4);
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar28 * dVar28;
  auVar12 = vfmadd231sd_fma(auVar7,auVar12,auVar12);
  auVar12 = vfmadd231sd_fma(auVar12,auVar6,auVar6);
  if (auVar12._0_8_ <= 1e-30) {
    dVar13 = 2.0;
  }
  else {
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dVar13 = atan2(auVar12._0_8_,dVar13);
    dVar13 = (dVar13 + dVar13) / auVar12._0_8_;
  }
  dVar28 = dVar41 * dVar28 * dVar13;
  dVar17 = dVar41 * dVar17 * dVar13;
  dVar13 = dVar41 * dVar14 * dVar13;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar28 * dVar28;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar17;
  auVar12 = vfmadd231sd_fma(auVar8,auVar25,auVar25);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar13;
  auVar12 = vfmadd231sd_fma(auVar12,auVar18,auVar18);
  if (auVar12._0_8_ <= 1e-30) {
    dVar14 = 0.5;
    auVar12 = ZEXT816(0x3ff0000000000000);
  }
  else {
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    local_60 = auVar12._0_8_ * 0.5;
    dVar14 = sin(local_60);
    dVar14 = dVar14 / auVar12._0_8_;
    auVar45._0_8_ = cos(local_60);
    auVar45._8_56_ = extraout_var;
    auVar12 = auVar45._0_16_;
  }
  dVar17 = dVar17 * dVar14;
  auVar53 = ZEXT864((ulong)dVar17);
  auVar50 = ZEXT864((ulong)(dVar28 * dVar14));
  dVar13 = dVar13 * dVar14;
  auVar45 = ZEXT864((ulong)dVar13);
  __return_storage_ptr__->m_data[1] = dVar17;
  __return_storage_ptr__->m_data[2] = dVar28 * dVar14;
  if (this->p < 1) {
    dVar17 = auVar12._0_8_;
  }
  else {
    lVar5 = (long)i * 4 + (long)iVar2 * -4 + 7;
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      auVar42._0_8_ = auVar45._0_8_;
      auVar46._0_8_ = auVar12._0_8_;
      auVar48._0_8_ = auVar50._0_8_;
      auVar51._0_8_ = auVar53._0_8_;
      if (local_58.m_storage.m_rows < lVar1) {
        __return_storage_ptr__->m_data[1] = auVar51._0_8_;
        __return_storage_ptr__->m_data[2] = auVar48._0_8_;
        __return_storage_ptr__->m_data[0] = auVar46._0_8_;
        __return_storage_ptr__->m_data[3] = auVar42._0_8_;
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      auVar40 = ZEXT816(0x4000000000000000);
      dVar41 = dVar41 - local_58.m_storage.m_data[lVar4];
      pCVar3 = (this->rotations).
               super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = pCVar3->m_data[lVar5 + -5];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = pCVar3->m_data[lVar5 + -3];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = pCVar3->m_data[lVar5 + -6];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = pCVar3->m_data[lVar5 + -7];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = pCVar3->m_data[lVar5 + -1];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = pCVar3->m_data[lVar5 + -2];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = pCVar3[-1].m_data[lVar5];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = pCVar3->m_data[lVar5];
      auVar6 = vmulsd_avx512f(auVar29,auVar26);
      auVar7 = vmulsd_avx512f(auVar29,auVar35);
      auVar8 = vmulsd_avx512f(auVar29,auVar16);
      auVar6 = vfmsub231sd_avx512f(auVar6,auVar22,auVar33);
      auVar7 = vfmsub231sd_avx512f(auVar7,auVar22,auVar39);
      auVar8 = vfmsub231sd_avx512f(auVar8,auVar22,auVar19);
      auVar6 = vfnmadd231sd_avx512f(auVar6,auVar16,auVar39);
      auVar7 = vfmadd231sd_avx512f(auVar7,auVar16,auVar33);
      auVar8 = vfmadd231sd_avx512f(auVar8,auVar26,auVar39);
      auVar9 = vfmadd231sd_avx512f(auVar6,auVar35,auVar19);
      auVar10 = vfnmadd231sd_avx512f(auVar7,auVar26,auVar19);
      auVar11 = vfnmadd231sd_avx512f(auVar8,auVar35,auVar33);
      auVar6 = vmulsd_avx512f(auVar9,auVar9);
      auVar6 = vfmadd231sd_avx512f(auVar6,auVar10,auVar10);
      auVar6 = vfmadd231sd_avx512f(auVar6,auVar11,auVar11);
      auVar47 = auVar12;
      auVar43 = auVar45._0_16_;
      auVar52 = auVar53._0_16_;
      auVar49 = auVar50._0_16_;
      if (1e-30 < auVar6._0_8_) {
        vmovsd_avx512f(auVar10);
        vmovsd_avx512f(auVar9);
        vmovsd_avx512f(auVar11);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = pCVar3->m_data[lVar5 + -6] * pCVar3->m_data[lVar5 + -2];
        auVar12 = vfmadd213sd_fma(auVar29,auVar22,auVar36);
        auVar12 = vfmadd213sd_fma(auVar33,auVar26,auVar12);
        auVar7 = vfmadd213sd_fma(auVar19,auVar16,auVar12);
        auVar12 = vsqrtsd_avx(auVar6,auVar6);
        dVar13 = atan2(auVar12._0_8_,auVar7._0_8_);
        auVar40._0_8_ = (dVar13 + dVar13) / auVar12._0_8_;
        auVar40._8_8_ = 0;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_40;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_38;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = local_60;
        auVar51._8_8_ = 0;
        auVar48._8_8_ = 0;
        auVar46._8_8_ = 0;
        auVar42._8_8_ = 0;
        auVar47 = auVar46;
        auVar43 = auVar42;
        auVar52 = auVar51;
        auVar49 = auVar48;
      }
      auVar12 = vmulsd_avx512f(auVar9,auVar40);
      auVar6 = vmulsd_avx512f(auVar10,auVar40);
      auVar7 = vmulsd_avx512f(auVar11,auVar40);
      dVar14 = 0.5;
      dVar13 = dVar41 * auVar12._0_8_;
      dVar17 = dVar41 * auVar6._0_8_;
      dVar28 = dVar41 * auVar7._0_8_;
      auVar6 = ZEXT816(0x3ff0000000000000);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar13 * dVar13;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = dVar17;
      auVar12 = vfmadd231sd_fma(auVar20,auVar23,auVar23);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar28;
      auVar12 = vfmadd231sd_fma(auVar12,auVar30,auVar30);
      if (1e-30 < auVar12._0_8_) {
        auVar12 = vsqrtsd_avx(auVar12,auVar12);
        local_30 = auVar12._0_8_ * 0.5;
        local_40 = dVar28;
        local_38 = dVar13;
        dVar14 = sin(local_30);
        dVar14 = dVar14 / auVar12._0_8_;
        auVar50._0_8_ = cos(local_30);
        auVar50._8_56_ = extraout_var_00;
        auVar6 = auVar50._0_16_;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = auVar51._0_8_;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = auVar48._0_8_;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = auVar46._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar42._0_8_;
        dVar28 = local_40;
        dVar13 = local_38;
        local_60 = dVar17;
      }
      dVar15 = auVar6._0_8_;
      lVar5 = lVar5 + 4;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = auVar52._0_8_ * dVar15;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar17 * dVar14;
      auVar12 = vfmadd231sd_fma(auVar24,auVar47,auVar34);
      auVar27._8_8_ = 0;
      auVar27._0_8_ = auVar49._0_8_ * dVar15;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = dVar13 * dVar14;
      auVar7 = vfmadd231sd_fma(auVar27,auVar47,auVar37);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = auVar52._0_8_ * dVar17 * dVar14;
      auVar6 = vfmsub231sd_fma(auVar21,auVar47,auVar6);
      auVar8 = vfnmadd231sd_fma(auVar12,auVar43,auVar37);
      auVar12 = vfmadd231sd_fma(auVar7,auVar43,auVar34);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar13 * dVar14;
      auVar7 = vfnmadd231sd_fma(auVar6,auVar49,auVar38);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar28 * dVar14;
      auVar6 = vfmadd231sd_fma(auVar8,auVar49,auVar31);
      auVar8 = vfnmadd231sd_fma(auVar12,auVar52,auVar31);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar28 * dVar14;
      auVar12 = vfnmadd231sd_fma(auVar7,auVar43,auVar32);
      dVar17 = auVar12._0_8_;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = auVar43._0_8_ * dVar15;
      auVar7 = vfmadd231sd_fma(auVar44,auVar47,auVar32);
      auVar7 = vfnmadd231sd_fma(auVar7,auVar49,auVar34);
      auVar50 = ZEXT1664(auVar8);
      auVar7 = vfmadd231sd_fma(auVar7,auVar52,auVar38);
      auVar45 = ZEXT1664(auVar7);
      dVar13 = auVar7._0_8_;
      auVar53 = ZEXT1664(auVar6);
      lVar4 = lVar1;
    } while (lVar1 < this->p);
    __return_storage_ptr__->m_data[1] = auVar6._0_8_;
    __return_storage_ptr__->m_data[2] = auVar8._0_8_;
  }
  __return_storage_ptr__->m_data[0] = dVar17;
  __return_storage_ptr__->m_data[3] = dVar13;
  if (local_58.m_storage.m_data != (double *)0x0) {
    free((void *)local_58.m_storage.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> ChFunctionRotation_spline::Get_q(double s) const {
	
	double fs = space_fx->Get_y(s);

	double mU;
	if (this->closed)
		mU = fmod(fs, 1.0);
	else
		mU = fs;

    double u = ComputeKnotUfromU(mU);

    int spanU = geometry::ChBasisToolsBspline::FindSpan(this->p, u, this->knots);

    ChVectorDynamic<> N(this->p + 1);
    geometry::ChBasisToolsBspline::BasisEvaluate(this->p, spanU, u, this->knots, N);

	// Use the quaternion spline interpolation as in Kim & Kim 1995 paper, ie. with cumulative basis.
	// Note: now, instead of creating a ChVectorDynamic<> Bi(this->p + 1); vector containing all the basis
	// recomputed in cumulative form, we just use a single scalar Bi and update it only when needed.
	
    int uind = spanU - p;
	ChQuaternion<> qqpowBi;
	ChQuaternion<> q0 = rotations[uind + 0];  // q0
	ChQuaternion<> q; 
	double Bi = 0;
	// should be Bi(0) = 1 in most cases, anyway: compute first cumulative basis:
	for (int j = 0; j < N.size(); ++j)
		Bi += N(j);  
	q.Q_from_Rotv(q0.Q_to_Rotv() * Bi);

    for (int i = 1; i <= this->p; i++) {
		// update cumulative basis - avoids repeating the sums, as it should be:  Bi=0; for (int j = i; j < N.size(); ++j) {Bi += N(j);} 
		Bi -= N(i-1); 
		// compute delta rotation
		qqpowBi.Q_from_Rotv((rotations[uind + i - 1].GetConjugate() * rotations[uind + i]).Q_to_Rotv() * Bi);
		// apply delta rotation
		q *= qqpowBi;
    }

	return q;
}